

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread.cpp
# Opt level: O2

bool __thiscall boost::thread::start_thread_noexcept(thread *this)

{
  int iVar1;
  type ptVar2;
  
  ptVar2 = shared_ptr<boost::detail::thread_data_base>::operator->(&this->thread_info);
  shared_ptr<boost::detail::thread_data_base>::operator=(&ptVar2->self,&this->thread_info);
  ptVar2 = shared_ptr<boost::detail::thread_data_base>::operator->(&this->thread_info);
  iVar1 = pthread_create(&ptVar2->thread_handle,(pthread_attr_t *)0x0,
                         (anonymous_namespace)::thread_proxy,(this->thread_info).px);
  if (iVar1 != 0) {
    ptVar2 = shared_ptr<boost::detail::thread_data_base>::operator->(&this->thread_info);
    shared_ptr<boost::detail::thread_data_base>::reset(&ptVar2->self);
  }
  return iVar1 == 0;
}

Assistant:

bool thread::start_thread_noexcept()
    {
        thread_info->self=thread_info;
        int const res = pthread_create(&thread_info->thread_handle, 0, &thread_proxy, thread_info.get());
        if (res != 0)
        {
            thread_info->self.reset();
            return false;
        }
        return true;
    }